

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O2

void testMultiPartThreading(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing the multi part APIs for multi-thread use")
  ;
  std::endl<char,std::char_traits<char>>(poVar2);
  random_reseed(1);
  IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::numThreads();
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_1a8469::testWriteRead(1,1,5,tempDir);
  anon_unknown.dwarf_1a8469::testWriteRead(2,2,10,tempDir);
  anon_unknown.dwarf_1a8469::testWriteRead(5,5,0x19,tempDir);
  anon_unknown.dwarf_1a8469::testWriteRead(0x32,2,0xfa,tempDir);
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void testMultiPartThreading (const std::string & tempDir)
{
    try
    {
        cout << "Testing the multi part APIs for multi-thread use" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(32);

        testWriteRead ( 1, 1,   5, tempDir);
        testWriteRead ( 2, 2,  10, tempDir);
        testWriteRead ( 5, 5,  25, tempDir);
        testWriteRead (50, 2, 250, tempDir);

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}